

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * __thiscall
gmlc::utilities::stringOps::removeChar_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view source,char remchar)

{
  undefined1 local_19;
  
  local_19 = source._M_str._0_1_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)this);
  std::
  __remove_copy_if<char_const*,std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
            ((char *)source._M_len,(char *)(this + (long)source._M_len),
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,(_Iter_equals_val<const_char>)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string removeChar(std::string_view source, char remchar)
    {
        std::string result;
        result.reserve(source.length());
        std::remove_copy(
            source.begin(), source.end(), std::back_inserter(result), remchar);
        return result;
    }